

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)1>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)1> *div)

{
  int iVar1;
  random_numerators<unsigned_int> *this;
  random_numerators<unsigned_int> *prVar2;
  uint *in_RSI;
  random_numerators<unsigned_int> *in_RDI;
  const_iterator iter;
  UIntT sum;
  uint32_t t;
  uint32_t q;
  uint64_t rl;
  uint64_t yl;
  uint64_t xl;
  random_numerators<unsigned_int> *prVar3;
  uint local_74;
  
  local_74 = 0;
  this = (random_numerators<unsigned_int> *)random_numerators<unsigned_int>::begin(in_RDI);
  while( true ) {
    prVar3 = this;
    prVar2 = (random_numerators<unsigned_int> *)random_numerators<unsigned_int>::end(this);
    if (this == prVar2) break;
    iVar1 = (int)((ulong)*(uint *)&prVar3->_pData * (ulong)*in_RSI >> 0x20);
    local_74 = ((*(uint *)&prVar3->_pData - iVar1 >> 1) + iVar1 >> ((byte)in_RSI[1] & 0x1f)) +
               local_74;
    this = (random_numerators<unsigned_int> *)((long)&prVar3->_pData + 4);
  }
  return (ulong)local_74;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}